

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  Rep *this_00;
  bool bVar1;
  CppType CVar2;
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar3;
  LogMessage *pLVar4;
  Type *local_160;
  MessageLite *result;
  LogMessage local_150;
  LogFinisher local_112;
  byte local_111;
  LogMessage local_110;
  LogFinisher local_d5 [20];
  byte local_c1;
  LogMessage local_c0;
  Extension *local_88;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  MessageLite *prototype_local;
  FieldType type_local;
  ExtensionSet *pEStack_68;
  int number_local;
  ExtensionSet *this_local;
  Rep *local_50;
  RepeatedPtrField<google::protobuf::MessageLite> *local_48;
  RepeatedPtrField<google::protobuf::MessageLite> local_40;
  RepeatedPtrField<google::protobuf::MessageLite> *local_28;
  RepeatedPtrField<google::protobuf::MessageLite> *t;
  byte local_11;
  Rep *local_10;
  
  extension = (Extension *)descriptor;
  descriptor_local = (FieldDescriptor *)prototype;
  prototype_local._3_1_ = type;
  prototype_local._4_4_ = number;
  pEStack_68 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_88);
  if (bVar1) {
    local_88->type = prototype_local._3_1_;
    CVar2 = anon_unknown_29::cpp_type(local_88->type);
    local_c1 = 0;
    if (CVar2 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2e7);
      local_c1 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_c0,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(local_d5,pLVar4);
    }
    if ((local_c1 & 1) != 0) {
      LogMessage::~LogMessage(&local_c0);
    }
    local_88->is_repeated = true;
    this_00 = (Rep *)this->arena_;
    local_50 = this_00;
    if (this_00 == (Rep *)0x0) {
      pRVar3 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
      RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField(pRVar3);
      local_48 = pRVar3;
    }
    else {
      local_40.super_RepeatedPtrFieldBase.current_size_ = 0;
      local_40.super_RepeatedPtrFieldBase.total_size_ = 0;
      local_40.super_RepeatedPtrFieldBase.rep_ = this_00;
      local_11 = Arena::
                 SkipDeleteList<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                           (0);
      t = &local_40;
      local_40.super_RepeatedPtrFieldBase.arena_ = (Arena *)this_00;
      local_10 = this_00;
      pRVar3 = (RepeatedPtrField<google::protobuf::MessageLite> *)
               Arena::AllocateAligned
                         ((Arena *)this_00,
                          (type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,
                          0x18);
      RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField
                (pRVar3,(t->super_RepeatedPtrFieldBase).arena_);
      local_28 = pRVar3;
      if ((local_11 & 1) == 0) {
        Arena::AddListNode((Arena *)this_00,pRVar3,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                          );
      }
      local_48 = local_28;
    }
    (local_88->field_0).repeated_message_value = local_48;
  }
  else {
    local_111 = 0;
    if ((local_88->is_repeated & 1U) == 0) {
      LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2ec);
      local_111 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_110,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=(&local_112,pLVar4);
    }
    if ((local_111 & 1) != 0) {
      LogMessage::~LogMessage(&local_110);
    }
    CVar2 = anon_unknown_29::cpp_type(local_88->type);
    result._7_1_ = 0;
    if (CVar2 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_150,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2ec);
      result._7_1_ = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_150,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)((long)&result + 6),pLVar4);
    }
    if ((result._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_150);
    }
  }
  local_160 = RepeatedPtrFieldBase::
              AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                        ((RepeatedPtrFieldBase *)(local_88->field_0).string_value);
  if (local_160 == (Type *)0x0) {
    local_160 = (Type *)(**(code **)(*(long *)descriptor_local + 0x20))
                                  (descriptor_local,this->arena_);
    RepeatedPtrField<google::protobuf::MessageLite>::AddAllocated
              ((local_88->field_0).repeated_message_value,local_160);
  }
  return local_160;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }

  // RepeatedPtrField<MessageLite> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = extension->repeated_message_value
      ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    result = prototype.New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}